

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O3

void __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>
          (packer<msgpack::v1::sbuffer> *this,long d)

{
  size_t in_RCX;
  void *__buf;
  uint uVar1;
  sbuffer *this_00;
  char buf [9];
  undefined1 local_9;
  ulong local_8;
  
  if (d < -0x20) {
    if (0xffffffffffff7fff < (ulong)d) {
      if (0xffffffffffffff7f < (ulong)d) {
        local_9 = 0xd0;
LAB_00147204:
        local_8 = CONCAT71(local_8._1_7_,(char)d);
        this_00 = this->m_stream;
        __buf = (void *)0x2;
        goto LAB_0014725e;
      }
      local_9 = 0xd1;
LAB_00147235:
      local_8 = CONCAT62(local_8._2_6_,(ushort)d << 8 | (ushort)d >> 8);
      this_00 = this->m_stream;
      __buf = (void *)0x3;
      goto LAB_0014725e;
    }
    if (0xffffffff7fffffff < (ulong)d) {
      local_9 = 0xd2;
LAB_00147223:
      uVar1 = (uint)d;
      local_8 = CONCAT44(local_8._4_4_,
                         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18);
      this_00 = this->m_stream;
      __buf = (void *)0x5;
      goto LAB_0014725e;
    }
    local_9 = 0xd3;
  }
  else {
    if (d < 0x80) {
      this_00 = this->m_stream;
      __buf = (void *)0x1;
      local_9 = (char)d;
      goto LAB_0014725e;
    }
    if ((ulong)d < 0x10000) {
      if ((ulong)d < 0x100) {
        local_9 = 0xcc;
        goto LAB_00147204;
      }
      local_9 = 0xcd;
      goto LAB_00147235;
    }
    if ((ulong)d >> 0x20 == 0) {
      local_9 = 0xce;
      goto LAB_00147223;
    }
    local_9 = 0xcf;
  }
  local_8 = (ulong)d >> 0x38 | (d & 0xff000000000000U) >> 0x28 | (d & 0xff0000000000U) >> 0x18 |
            (d & 0xff00000000U) >> 8 | (d & 0xff000000U) << 8 | (d & 0xff0000U) << 0x18 |
            (d & 0xff00U) << 0x28 | d << 0x38;
  this_00 = this->m_stream;
  __buf = (void *)0x9;
LAB_0014725e:
  sbuffer::write(this_00,(int)&local_9,__buf,in_RCX);
  return;
}

Assistant:

inline void packer<Stream>::pack_imp_int64(T d)
{
    if(d < -(1LL<<5)) {
        if(d < -(1LL<<15)) {
            if(d < -(1LL<<31)) {
                /* signed 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xd3u); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            } else {
                /* signed 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xd2u); _msgpack_store32(&buf[1], static_cast<int32_t>(d));
                append_buffer(buf, 5);
            }
        } else {
            if(d < -(1<<7)) {
                /* signed 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xd1u); _msgpack_store16(&buf[1], static_cast<int16_t>(d));
                append_buffer(buf, 3);
            } else {
                /* signed 8 */
                char buf[2] = {static_cast<char>(0xd0u), take8_64(d)};
                append_buffer(buf, 2);
            }
        }
    } else if(d < (1<<7)) {
        /* fixnum */
        char buf = take8_64(d);
        append_buffer(&buf, 1);
    } else {
        if(d < (1LL<<16)) {
            if(d < (1<<8)) {
                /* unsigned 8 */
                char buf[2] = {static_cast<char>(0xccu), take8_64(d)};
                append_buffer(buf, 2);
            } else {
                /* unsigned 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xcdu); _msgpack_store16(&buf[1], static_cast<uint16_t>(d));
                append_buffer(buf, 3);
            }
        } else {
            if(d < (1LL<<32)) {
                /* unsigned 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xceu); _msgpack_store32(&buf[1], static_cast<uint32_t>(d));
                append_buffer(buf, 5);
            } else {
                /* unsigned 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xcfu); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            }
        }
    }
}